

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O3

void __thiscall duckdb::FixedSizeBuffer::~FixedSizeBuffer(FixedSizeBuffer *this)

{
  BufferHandle *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    this_00 = &this->buffer_handle;
    bVar1 = BufferHandle::IsValid(this_00);
    if (bVar1) {
      BufferHandle::Destroy(this_00);
    }
    if ((this->block_pointer).block_id != -1) {
      (*this->block_manager->_vptr_BlockManager[9])();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    this_01 = (this->block_handle).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    BufferHandle::~BufferHandle(this_00);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

FixedSizeBuffer::~FixedSizeBuffer() {
	lock_guard<mutex> l(lock);
	if (InMemory()) {
		// we can have multiple readers on a pinned block, and unpinning the buffer handle
		// decrements the reader count on the underlying block handle (Destroy() unpins)
		buffer_handle.Destroy();
	}
	if (OnDisk()) {
		// marking a block as modified decreases the reference count of multi-use blocks
		block_manager.MarkBlockAsModified(block_pointer.block_id);
	}
}